

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_FSA_kry.c
# Opt level: O0

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  sunrealtype A4;
  sunrealtype A3;
  sunrealtype C3;
  sunrealtype Q2;
  sunrealtype Q1;
  UserData data;
  int iright;
  int ileft;
  int iup;
  int idn;
  int jz;
  int jx;
  sunrealtype *dydata;
  sunrealtype *ydata;
  sunrealtype horaco;
  sunrealtype hordco;
  sunrealtype verdco;
  sunrealtype delz;
  sunrealtype q4coef;
  sunrealtype zup;
  sunrealtype zdn;
  sunrealtype vertd2;
  sunrealtype vertd1;
  sunrealtype s;
  sunrealtype rkin2;
  sunrealtype rkin1;
  sunrealtype qq4;
  sunrealtype qq3;
  sunrealtype qq2;
  sunrealtype qq1;
  sunrealtype horad2;
  sunrealtype horad1;
  sunrealtype hord2;
  sunrealtype hord1;
  sunrealtype czup;
  sunrealtype czdn;
  sunrealtype c2rt;
  sunrealtype c1rt;
  sunrealtype c2lt;
  sunrealtype c1lt;
  sunrealtype c2up;
  sunrealtype c1up;
  sunrealtype c2dn;
  sunrealtype c1dn;
  sunrealtype c2;
  sunrealtype c1;
  sunrealtype q3;
  int local_140;
  int local_13c;
  double local_28;
  
  lVar19 = N_VGetArrayPointer(in_RDI);
  lVar20 = N_VGetArrayPointer(in_RSI);
  dVar1 = *(double *)*in_RDX;
  dVar2 = *(double *)(*in_RDX + 8);
  dVar3 = *(double *)(*in_RDX + 0x10);
  dVar22 = *(double *)(*in_RDX + 0x18);
  dVar4 = *(double *)(*in_RDX + 0x20);
  dVar21 = sin((double)in_RDX[0x2a5] * in_XMM0_Qa);
  if (dVar21 <= 0.0) {
    local_28 = 0.0;
    in_RDX[0x2a4] = 0;
  }
  else {
    local_28 = exp(-dVar22 / dVar21);
    dVar22 = exp(-dVar4 / dVar21);
    in_RDX[0x2a4] = (long)dVar22;
  }
  dVar22 = (double)in_RDX[0x2a4];
  dVar4 = (double)in_RDX[0x2a7];
  dVar21 = (double)in_RDX[0x2aa];
  dVar5 = (double)in_RDX[0x2a8];
  dVar6 = (double)in_RDX[0x2a9];
  for (local_140 = 0; local_140 < 0xf; local_140 = local_140 + 1) {
    dVar23 = ((double)local_140 - 0.5) * dVar4 + 30.0;
    dVar24 = exp(dVar23 * 0.2);
    dVar24 = dVar21 * dVar24;
    dVar23 = exp((dVar23 + dVar4) * 0.2);
    dVar23 = dVar21 * dVar23;
    iVar15 = -1;
    if (local_140 == 0) {
      iVar15 = 1;
    }
    iVar16 = 1;
    if (local_140 == 0xe) {
      iVar16 = -1;
    }
    for (local_13c = 0; local_13c < 0xf; local_13c = local_13c + 1) {
      dVar7 = *(double *)(lVar19 + (long)(local_13c * 2 + local_140 * 0x1e) * 8);
      dVar8 = *(double *)(lVar19 + (long)(local_13c * 2 + 1 + local_140 * 0x1e) * 8);
      dVar25 = dVar1 * dVar7 * dVar3;
      dVar26 = dVar2 * dVar7 * dVar8;
      dVar27 = local_28 * dVar3;
      dVar9 = *(double *)(lVar19 + (long)(local_13c * 2 + 1 + (local_140 + iVar15) * 0x1e) * 8);
      dVar10 = *(double *)(lVar19 + (long)(local_13c * 2 + 1 + (local_140 + iVar16) * 0x1e) * 8);
      iVar17 = -1;
      if (local_13c == 0) {
        iVar17 = 1;
      }
      iVar18 = 1;
      if (local_13c == 0xe) {
        iVar18 = -1;
      }
      dVar11 = *(double *)(lVar19 + (long)((local_13c + iVar17) * 2 + local_140 * 0x1e) * 8);
      dVar12 = *(double *)(lVar19 + (long)((local_13c + iVar17) * 2 + 1 + local_140 * 0x1e) * 8);
      dVar13 = *(double *)(lVar19 + (long)((local_13c + iVar18) * 2 + local_140 * 0x1e) * 8);
      dVar14 = *(double *)(lVar19 + (long)((local_13c + iVar18) * 2 + 1 + local_140 * 0x1e) * 8);
      *(double *)(lVar20 + (long)(local_13c * 2 + local_140 * 0x1e) * 8) =
           dVar23 * (*(double *)(lVar19 + (long)(local_13c * 2 + (local_140 + iVar16) * 0x1e) * 8) -
                    dVar7) +
           -(dVar24 * (dVar7 - *(double *)
                                (lVar19 + (long)(local_13c * 2 + (local_140 + iVar15) * 0x1e) * 8)))
           + dVar5 * ((dVar13 - (dVar7 + dVar7)) + dVar11) + dVar6 * (dVar13 - dVar11) +
           dVar27 + dVar27 + (-dVar25 - dVar26) + dVar22 * dVar8;
      *(double *)(lVar20 + (long)(local_13c * 2 + 1 + local_140 * 0x1e) * 8) =
           dVar23 * (dVar10 - dVar8) + -(dVar24 * (dVar8 - dVar9)) +
           dVar5 * ((dVar14 - (dVar8 + dVar8)) + dVar12) + dVar6 * (dVar14 - dVar12) +
           ((dVar25 - dVar26) - dVar22 * dVar8);
    }
  }
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype q3, c1, c2, c1dn, c2dn, c1up, c2up, c1lt, c2lt;
  sunrealtype c1rt, c2rt, czdn, czup, hord1, hord2, horad1, horad2;
  sunrealtype qq1, qq2, qq3, qq4, rkin1, rkin2, s, vertd1, vertd2, zdn, zup;
  sunrealtype q4coef, delz, verdco, hordco, horaco;
  sunrealtype *ydata, *dydata;
  int jx, jz, idn, iup, ileft, iright;
  UserData data;
  sunrealtype Q1, Q2, C3, A3, A4;

  data   = (UserData)user_data;
  ydata  = N_VGetArrayPointer(y);
  dydata = N_VGetArrayPointer(ydot);

  /* Load problem coefficients and parameters */

  Q1 = data->p[0];
  Q2 = data->p[1];
  C3 = data->p[2];
  A3 = data->p[3];
  A4 = data->p[4];

  /* Set diurnal rate coefficients. */

  s = sin(data->om * t);
  if (s > ZERO)
  {
    q3       = exp(-A3 / s);
    data->q4 = exp(-A4 / s);
  }
  else
  {
    q3       = ZERO;
    data->q4 = ZERO;
  }

  /* Make local copies of problem variables, for efficiency. */

  q4coef = data->q4;
  delz   = data->dz;
  verdco = data->vdco;
  hordco = data->hdco;
  horaco = data->haco;

  /* Loop over all grid points. */

  for (jz = 0; jz < MZ; jz++)
  {
    /* Set vertical diffusion coefficients at jz +- 1/2 */

    zdn  = ZMIN + (jz - SUN_RCONST(0.5)) * delz;
    zup  = zdn + delz;
    czdn = verdco * exp(SUN_RCONST(0.2) * zdn);
    czup = verdco * exp(SUN_RCONST(0.2) * zup);
    idn  = (jz == 0) ? 1 : -1;
    iup  = (jz == MZ - 1) ? -1 : 1;
    for (jx = 0; jx < MX; jx++)
    {
      /* Extract c1 and c2, and set kinetic rate terms. */

      c1    = IJKth(ydata, 1, jx, jz);
      c2    = IJKth(ydata, 2, jx, jz);
      qq1   = Q1 * c1 * C3;
      qq2   = Q2 * c1 * c2;
      qq3   = q3 * C3;
      qq4   = q4coef * c2;
      rkin1 = -qq1 - qq2 + SUN_RCONST(2.0) * qq3 + qq4;
      rkin2 = qq1 - qq2 - qq4;

      /* Set vertical diffusion terms. */

      c1dn   = IJKth(ydata, 1, jx, jz + idn);
      c2dn   = IJKth(ydata, 2, jx, jz + idn);
      c1up   = IJKth(ydata, 1, jx, jz + iup);
      c2up   = IJKth(ydata, 2, jx, jz + iup);
      vertd1 = czup * (c1up - c1) - czdn * (c1 - c1dn);
      vertd2 = czup * (c2up - c2) - czdn * (c2 - c2dn);

      /* Set horizontal diffusion and advection terms. */

      ileft  = (jx == 0) ? 1 : -1;
      iright = (jx == MX - 1) ? -1 : 1;
      c1lt   = IJKth(ydata, 1, jx + ileft, jz);
      c2lt   = IJKth(ydata, 2, jx + ileft, jz);
      c1rt   = IJKth(ydata, 1, jx + iright, jz);
      c2rt   = IJKth(ydata, 2, jx + iright, jz);
      hord1  = hordco * (c1rt - SUN_RCONST(2.0) * c1 + c1lt);
      hord2  = hordco * (c2rt - SUN_RCONST(2.0) * c2 + c2lt);
      horad1 = horaco * (c1rt - c1lt);
      horad2 = horaco * (c2rt - c2lt);

      /* Load all terms into ydot. */

      IJKth(dydata, 1, jx, jz) = vertd1 + hord1 + horad1 + rkin1;
      IJKth(dydata, 2, jx, jz) = vertd2 + hord2 + horad2 + rkin2;
    }
  }

  return (0);
}